

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O3

char vrna_nucleotide_decode(int enc,vrna_md_t *md)

{
  if (md == (vrna_md_t *)0x0) {
    return '\0';
  }
  if (0 < md->energy_set) {
    return (char)enc + '@';
  }
  return "_ACGUTXKI"[enc];
}

Assistant:

PUBLIC char
vrna_nucleotide_decode(int        enc,
                       vrna_md_t  *md)
{
  if (md) {
    if (md->energy_set > 0)
      return (char)enc + 'A' - 1;
    else
      return (char)Law_and_Order[enc];
  } else {
    return (char)0;
  }
}